

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.h
# Opt level: O2

int av1_check_newmv_joint_nonzero(AV1_COMMON *cm,MACROBLOCK *x)

{
  byte bVar1;
  long lVar2;
  int_mv iVar3;
  int_mv iVar4;
  
  lVar2 = *(long *)(cm->quant_params).gqmatrix[0][1][0xb];
  bVar1 = *(byte *)(lVar2 + 2);
  if ((bVar1 == 0x13) || (bVar1 == 0x15)) {
    iVar4 = av1_get_ref_mv((MACROBLOCK *)cm,1);
  }
  else {
    if (bVar1 != 0x18) {
      if (((bVar1 & 0xfd) != 0x14) && (bVar1 != 0x10)) {
        return 1;
      }
      iVar4 = av1_get_ref_mv((MACROBLOCK *)cm,0);
      if (*(uint32_t *)(lVar2 + 8) != iVar4.as_int) {
        return 1;
      }
      return 0;
    }
    iVar3 = av1_get_ref_mv((MACROBLOCK *)cm,0);
    iVar4 = av1_get_ref_mv((MACROBLOCK *)cm,1);
    if (*(uint32_t *)(lVar2 + 8) == iVar3.as_int) {
      return 0;
    }
  }
  if (*(uint32_t *)(lVar2 + 0xc) != iVar4.as_int) {
    return 1;
  }
  return 0;
}

Assistant:

static inline int av1_check_newmv_joint_nonzero(const AV1_COMMON *cm,
                                                MACROBLOCK *const x) {
  (void)cm;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const PREDICTION_MODE this_mode = mbmi->mode;
  if (this_mode == NEW_NEWMV) {
    const int_mv ref_mv_0 = av1_get_ref_mv(x, 0);
    const int_mv ref_mv_1 = av1_get_ref_mv(x, 1);
    if (mbmi->mv[0].as_int == ref_mv_0.as_int ||
        mbmi->mv[1].as_int == ref_mv_1.as_int) {
      return 0;
    }
  } else if (this_mode == NEAREST_NEWMV || this_mode == NEAR_NEWMV) {
    const int_mv ref_mv_1 = av1_get_ref_mv(x, 1);
    if (mbmi->mv[1].as_int == ref_mv_1.as_int) {
      return 0;
    }
  } else if (this_mode == NEW_NEARESTMV || this_mode == NEW_NEARMV) {
    const int_mv ref_mv_0 = av1_get_ref_mv(x, 0);
    if (mbmi->mv[0].as_int == ref_mv_0.as_int) {
      return 0;
    }
  } else if (this_mode == NEWMV) {
    const int_mv ref_mv_0 = av1_get_ref_mv(x, 0);
    if (mbmi->mv[0].as_int == ref_mv_0.as_int) {
      return 0;
    }
  }
  return 1;
}